

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_number_toPrecision(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t tag;
  int64_t iVar5;
  JSValueUnion JVar6;
  JSValue val;
  JSValue JVar7;
  JSValue JVar8;
  JSValue val_00;
  double d;
  int p;
  JSValueUnion local_30;
  int local_24;
  
  JVar7 = js_thisNumberValue(ctx,this_val);
  uVar3 = (uint)JVar7.tag;
  if (uVar3 == 6) {
    JVar2.float64 = -NAN;
    JVar6 = JVar7.u;
  }
  else {
    if (2 < uVar3) {
      JVar6 = JVar7.u;
      if ((uVar3 == 7) ||
         (iVar1 = __JS_ToFloat64Free(ctx,&local_30.float64,JVar7), JVar6 = local_30, iVar1 == 0))
      goto LAB_00166154;
LAB_001661ab:
      JVar6.float64 = 0.0;
      iVar5 = 6;
      uVar4 = 0;
      goto LAB_001661ad;
    }
    JVar6.float64 = (double)JVar7.u._0_4_;
LAB_00166154:
    local_30 = JVar6;
    iVar5 = argv->tag;
    uVar3 = (uint)iVar5;
    if (uVar3 == 3) {
LAB_00166163:
      val.tag = 7;
      val.u.float64 = local_30.float64;
      JVar7 = JS_ToStringInternal(ctx,val,0);
    }
    else {
      JVar6 = (JSValueUnion)(argv->u).ptr;
      if (0xfffffff4 < uVar3) {
        *(int *)JVar6.ptr = *JVar6.ptr + 1;
      }
      val_00.tag = iVar5;
      val_00.u.ptr = JVar6.ptr;
      iVar1 = JS_ToInt32SatFree(ctx,&local_24,val_00);
      if (iVar1 != 0) goto LAB_001661ab;
      if (0x7fefffffffffffff < ((ulong)local_30.ptr & 0x7fffffffffffffff)) goto LAB_00166163;
      if (local_24 - 0x65U < 0xffffff9c) {
        JS_ThrowRangeError(ctx,"invalid number of digits");
        goto LAB_001661ab;
      }
      JVar7 = js_dtoa(ctx,local_30.float64,10,local_24,1);
    }
    JVar2 = JVar7.u;
    JVar7.tag = JVar7.tag;
    JVar7.u.float64 = -NAN;
    JVar6 = JVar2;
  }
  iVar5 = JVar7.tag;
  uVar4 = (ulong)JVar7.u.ptr & (ulong)JVar2.ptr;
LAB_001661ad:
  JVar8.u.ptr = (void *)((ulong)JVar6.ptr & 0xffffffff | uVar4);
  JVar8.tag = iVar5;
  return JVar8;
}

Assistant:

static JSValue js_number_toPrecision(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val;
    int p;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    if (JS_IsUndefined(argv[0]))
        goto to_string;
    if (JS_ToInt32Sat(ctx, &p, argv[0]))
        return JS_EXCEPTION;
    if (!isfinite(d)) {
    to_string:
        return JS_ToStringFree(ctx,  __JS_NewFloat64(ctx, d));
    }
    if (p < 1 || p > 100)
        return JS_ThrowRangeError(ctx, "invalid number of digits");
    return js_dtoa(ctx, d, 10, p, JS_DTOA_FIXED_FORMAT);
}